

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O1

void __thiscall CPubKey::Serialize<DataStream>(CPubKey *this,DataStream *s)

{
  long lVar1;
  byte bVar2;
  uint64_t nSize;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = 0x21;
  if ((this->vch[0] & 0xfe) != 2) {
    bVar2 = this->vch[0] - 4;
    if (bVar2 < 4) {
      nSize = (&DAT_00846808)[bVar2];
    }
    else {
      nSize = 0;
    }
  }
  WriteCompactSize<DataStream>(s,nSize);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,this,this->vch + nSize);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        unsigned int len = size();
        ::WriteCompactSize(s, len);
        s << Span{vch, len};
    }